

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.h
# Opt level: O0

bool __thiscall
JsUtil::ReadOnlyList<unsigned_long,_Memory::HeapAllocator,_DefaultComparer>::Contains
          (ReadOnlyList<unsigned_long,_Memory::HeapAllocator,_DefaultComparer> *this,
          unsigned_long *item)

{
  bool bVar1;
  int local_24;
  int i;
  unsigned_long *item_local;
  ReadOnlyList<unsigned_long,_Memory::HeapAllocator,_DefaultComparer> *this_local;
  
  local_24 = 0;
  while( true ) {
    if (this->count <= local_24) {
      return false;
    }
    bVar1 = DefaultComparer<unsigned_long>::Equals(*item,this->buffer[local_24]);
    if (bVar1) break;
    local_24 = local_24 + 1;
  }
  return true;
}

Assistant:

bool Contains(const T& item) const
        {
            for (int i = 0; i < count; i++)
            {
                if (TComparerType::Equals(item, buffer[i]))
                {
                    return true;
                }
            }
            return false;
        }